

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_pass.cpp
# Opt level: O0

bool __thiscall spvtools::opt::MemPass::HasOnlyNamesAndDecorates(MemPass *this,uint32_t id)

{
  uint32_t id_00;
  bool bVar1;
  DefUseManager *this_00;
  anon_class_8_1_8991fb9c local_40;
  function<bool_(spvtools::opt::Instruction_*)> local_38;
  uint32_t local_14;
  MemPass *pMStack_10;
  uint32_t id_local;
  MemPass *this_local;
  
  local_14 = id;
  pMStack_10 = this;
  this_00 = Pass::get_def_use_mgr(&this->super_Pass);
  id_00 = local_14;
  local_40.this = this;
  std::function<bool(spvtools::opt::Instruction*)>::
  function<spvtools::opt::MemPass::HasOnlyNamesAndDecorates(unsigned_int)const::__0,void>
            ((function<bool(spvtools::opt::Instruction*)> *)&local_38,&local_40);
  bVar1 = analysis::DefUseManager::WhileEachUser(this_00,id_00,&local_38);
  std::function<bool_(spvtools::opt::Instruction_*)>::~function(&local_38);
  return bVar1;
}

Assistant:

bool MemPass::HasOnlyNamesAndDecorates(uint32_t id) const {
  return get_def_use_mgr()->WhileEachUser(id, [this](Instruction* user) {
    spv::Op op = user->opcode();
    if (op != spv::Op::OpName && !IsNonTypeDecorate(op)) {
      return false;
    }
    return true;
  });
}